

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O3

void __thiscall
tchecker::tck_simulate::hr_display_t::output(hr_display_t *this,const_transition_sptr_t *t)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attr;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  zg::zg_t::attributes
            ((this->_zg).super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,t
             ,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = this->_os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var3 + 2),(long)p_Var3[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void hr_display_t::output(tchecker::zg::const_transition_sptr_t const & t)
{
  std::map<std::string, std::string> attr;
  _zg->attributes(t, attr);
  for (auto && [key, value] : attr)
    _os << "\t" << key << ": " << value << " ";
}